

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

void __thiscall
glslang::TSmallArrayVector::copyNonFront(TSmallArrayVector *this,TSmallArrayVector *rhs)

{
  vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *this_00;
  int iVar1;
  iterator __last;
  __normal_iterator<glslang::TArraySize_*,_std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>_>
  local_38;
  __normal_iterator<glslang::TArraySize_*,_std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>_>
  local_30;
  __normal_iterator<glslang::TArraySize_*,_std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>_>
  local_28;
  const_iterator local_20;
  TSmallArrayVector *local_18;
  TSmallArrayVector *rhs_local;
  TSmallArrayVector *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  if (this->sizes == (TVector<glslang::TArraySize> *)0x0) {
    iVar1 = size(rhs);
    if (1 < iVar1) {
      alloc(this);
      this_00 = (vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *)
                this->sizes;
      local_28._M_current =
           (TArraySize *)
           std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::begin
                     (&this->sizes->
                       super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                     );
      __gnu_cxx::
      __normal_iterator<glslang::TArraySize_const*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>
      ::__normal_iterator<glslang::TArraySize*>
                ((__normal_iterator<glslang::TArraySize_const*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>
                  *)&local_20,&local_28);
      local_38._M_current =
           (TArraySize *)
           std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::begin
                     (&local_18->sizes->
                       super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                     );
      local_30 = __gnu_cxx::
                 __normal_iterator<glslang::TArraySize_*,_std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>_>
                 ::operator+(&local_38,1);
      __last = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::end
                         (&local_18->sizes->
                           super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                         );
      std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>::
      insert<__gnu_cxx::__normal_iterator<glslang::TArraySize*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>,void>
                (this_00,local_20,local_30,
                 (__normal_iterator<glslang::TArraySize_*,_std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>_>
                  )__last._M_current);
    }
    return;
  }
  __assert_fail("sizes == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                ,0xa5,"void glslang::TSmallArrayVector::copyNonFront(const TSmallArrayVector &)");
}

Assistant:

void copyNonFront(const TSmallArrayVector& rhs)
    {
        assert(sizes == nullptr);
        if (rhs.size() > 1) {
            alloc();
            sizes->insert(sizes->begin(), rhs.sizes->begin() + 1, rhs.sizes->end());
        }
    }